

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O3

void object_suite::fail_missing_end(void)

{
  bool bVar1;
  char input [2];
  reader reader;
  uint local_174;
  view_type local_170;
  char local_15a [2];
  basic_reader<char> local_158;
  
  local_15a[0] = '{';
  local_15a[1] = '\0';
  local_170._M_len = strlen(local_15a);
  local_170._M_str = local_15a;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,&local_170);
  local_170._M_len = CONCAT44(local_170._M_len._4_4_,local_158.decoder.current.code);
  local_174 = 0xe;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x3d8,"void object_suite::fail_missing_end()",&local_170,&local_174);
  if ((long)local_158.stack.c.
            super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_158.stack.c.
            super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    local_170._M_len =
         ((long)local_158.stack.c.
                super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_158.stack.c.
                super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
    local_174 = 1;
    boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
              ("reader.level()","1",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
               ,0x3d9,"void object_suite::fail_missing_end()",&local_170,&local_174);
    local_170._M_len =
         (long)local_158.decoder.current.view.tail - (long)local_158.decoder.current.view.head;
    local_170._M_str = local_158.decoder.current.view.head;
    boost::detail::
    test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
              ("reader.literal()","\"{\"",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
               ,0x3da,"void object_suite::fail_missing_end()",&local_170,"{");
    local_170._M_len = (long)local_158.decoder.input.tail - (long)local_158.decoder.input.head;
    local_170._M_str = local_158.decoder.input.head;
    boost::detail::
    test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[1]>
              ("reader.tail()","\"\"",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
               ,0x3db,"void object_suite::fail_missing_end()",&local_170,"");
    bVar1 = trial::protocol::json::basic_reader<char>::next(&local_158);
    local_170._M_len = CONCAT71(local_170._M_len._1_7_,bVar1);
    local_174 = local_174 & 0xffffff00;
    boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
              ("reader.next()","false",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
               ,0x3dc,"void object_suite::fail_missing_end()",&local_170,&local_174);
    local_170._M_len = CONCAT44(local_170._M_len._4_4_,local_158.decoder.current.code);
    local_174 = 0xfffffff8;
    boost::detail::
    test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
              ("reader.code()","token::code::error_expected_end_object",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
               ,0x3dd,"void object_suite::fail_missing_end()",&local_170,&local_174);
    if ((long)local_158.stack.c.
              super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_158.stack.c.
              super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      local_170._M_len =
           ((long)local_158.stack.c.
                  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_158.stack.c.
                  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
      local_174 = 1;
      boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
                ("reader.level()","1",
                 "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                 ,0x3de,"void object_suite::fail_missing_end()",&local_170,&local_174);
      if (local_158.stack.c.
          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_158.stack.c.
                        super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_158.stack.c.
                              super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_158.stack.c.
                              super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  }
  __assert_fail("stack.size() > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/cmake/../include/trial/protocol/json/detail/reader.ipp"
                ,0x107,
                "size_type trial::protocol::json::basic_reader<char>::level() const [CharT = char]")
  ;
}

Assistant:

void fail_missing_end()
{
    const char input[] = "{";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_object);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "{");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), "");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::error_expected_end_object);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
}